

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

statement_ptr __thiscall
mjs::parser::
make_statement<mjs::return_statement,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
          (parser *this,unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *args)

{
  expression *peVar1;
  pointer pwVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  undefined8 *in_RDX;
  undefined8 *puVar4;
  size_type sVar5;
  
  peVar1 = args[0xe]._M_t.
           super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
           super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
           super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
  if (peVar1 != (expression *)0x0) {
    peVar3 = (element_type *)operator_new(0x28);
    puVar4 = (peVar1->super_syntax_node)._vptr_syntax_node;
    pwVar2 = (pointer)*puVar4;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar4[1];
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
        puVar4 = (peVar1->super_syntax_node)._vptr_syntax_node;
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    sVar5 = CONCAT44(*(undefined4 *)((long)puVar4 + 100),
                     *(uint32_t *)((long)&(peVar1->super_syntax_node).extend_ + 0x10));
    *(undefined ***)peVar3 = &PTR__syntax_node_001d6118;
    (peVar3->filename_)._M_dataplus._M_p = pwVar2;
    (peVar3->filename_)._M_string_length = (size_type)this_00;
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (peVar3->filename_).field_2._M_allocated_capacity = sVar5;
      *(undefined ***)peVar3 = &PTR__return_statement_001d6790;
      *(undefined8 *)((long)&(peVar3->filename_).field_2 + 8) = *in_RDX;
      *in_RDX = 0;
      (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar3;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      (peVar3->filename_).field_2._M_allocated_capacity = sVar5;
      *(undefined ***)peVar3 = &PTR__return_statement_001d6790;
      *(undefined8 *)((long)&(peVar3->filename_).field_2 + 8) = *in_RDX;
      *in_RDX = 0;
      (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar3;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    return (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)
           (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)this;
  }
  __assert_fail("statement_pos_",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp",
                0x147,
                "statement_ptr mjs::parser::make_statement(Args &&...) [T = mjs::return_statement, Args = <std::unique_ptr<mjs::expression>>]"
               );
}

Assistant:

statement_ptr make_statement(Args&&... args) {
        assert(statement_pos_);
        auto s = statement_ptr{new T{statement_pos_->extend(), std::forward<Args>(args)...}};
#ifdef PARSER_DEBUG
        std::wcout << s->extend() << " Producting: " << *s << "\n";
#endif
        return s;
    }